

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::region::~region(region *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::__cxx11::string::~string(in_RDI);
  CLI::std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  ~shared_ptr((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              0x2092b6);
  return;
}

Assistant:

~region() = default;